

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

bool __thiscall slang::driver::Driver::reportParseDiags(Driver *this)

{
  int iVar1;
  pointer psVar2;
  string_view text;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  long lVar3;
  Diagnostic *diag;
  pointer diagnostic;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  pointer psVar4;
  string_view fmt;
  format_args args;
  _Alloc_hider in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  string local_148;
  pointer local_128;
  size_type sStack_120;
  Diagnostics diags;
  
  diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)diags.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len = 0;
  diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  psVar2 = (this->sourceLoader).libraryMapTrees.
           super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (this->sourceLoader).libraryMapTrees.
                super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar2; psVar4 = psVar4 + 1) {
    SmallVectorBase<slang::Diagnostic>::append_range<slang::Diagnostics>
              ((SmallVectorBase<slang::Diagnostic> *)&diags,
               &((psVar4->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)
                ._M_ptr)->diagnosticsBuffer);
  }
  psVar2 = (this->syntaxTrees).
           super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (this->syntaxTrees).
                super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar2; psVar4 = psVar4 + 1) {
    SmallVectorBase<slang::Diagnostic>::append_range<slang::Diagnostics>
              ((SmallVectorBase<slang::Diagnostic> *)&diags,
               &((psVar4->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)
                ._M_ptr)->diagnosticsBuffer);
  }
  Diagnostics::sort(&diags,&this->sourceManager);
  diagnostic = diags.super_SmallVector<slang::Diagnostic,_2UL>.
               super_SmallVectorBase<slang::Diagnostic>.data_;
  for (lVar3 = diags.super_SmallVector<slang::Diagnostic,_2UL>.
               super_SmallVectorBase<slang::Diagnostic>.len * 0x70; lVar3 != 0;
      lVar3 = lVar3 + -0x70) {
    DiagnosticEngine::issue(&this->diagEngine,diagnostic);
    diagnostic = diagnostic + 1;
  }
  TextDiagnosticClient::getString_abi_cxx11_
            (&local_148,
             (this->textDiagClient).
             super___shared_ptr<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_128 = local_148._M_dataplus._M_p;
  sStack_120 = local_148._M_string_length;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x2;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_128;
  ::fmt::v11::vformat_abi_cxx11_((string *)&stack0xfffffffffffffe98,(v11 *)0x42c361,fmt,args);
  text._M_str = in_stack_fffffffffffffea0;
  text._M_len = (size_t)in_stack_fffffffffffffe98._M_p;
  OS::printE(text);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe98);
  std::__cxx11::string::~string((string *)&local_148);
  iVar1 = (this->diagEngine).numErrors;
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&diags,
             (EVP_PKEY_CTX *)in_stack_fffffffffffffe98._M_p);
  return iVar1 == 0;
}

Assistant:

bool Driver::reportParseDiags() {
    Diagnostics diags;
    for (auto& tree : sourceLoader.getLibraryMaps())
        diags.append_range(tree->diagnostics());
    for (auto& tree : syntaxTrees)
        diags.append_range(tree->diagnostics());

    diags.sort(sourceManager);
    for (auto& diag : diags)
        diagEngine.issue(diag);

    OS::printE(fmt::format("{}", textDiagClient->getString()));
    return diagEngine.getNumErrors() == 0;
}